

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O2

sljit_s32 sljit_emit_ijump(sljit_compiler *compiler,sljit_s32 type,sljit_s32 src,sljit_sw srcw)

{
  sljit_jump *psVar1;
  undefined1 *puVar2;
  sljit_u8 *psVar3;
  sljit_jump *psVar4;
  int iVar5;
  
  iVar5 = compiler->error;
  if (iVar5 == 0) {
    if (src == 0x40) {
      psVar1 = (sljit_jump *)ensure_abuf(compiler,0x20);
      if (psVar1 != (sljit_jump *)0x0) {
        psVar1->next = (sljit_jump *)0x0;
        psVar1->flags = 2;
        psVar4 = (sljit_jump *)&compiler->jumps;
        if (compiler->last_jump != (sljit_jump *)0x0) {
          psVar4 = compiler->last_jump;
        }
        psVar4->next = psVar1;
        compiler->last_jump = psVar1;
        (psVar1->u).target = srcw;
        compiler->size = compiler->size + 0xd;
        puVar2 = (undefined1 *)ensure_buf(compiler,2);
        if (puVar2 != (undefined1 *)0x0) {
          *puVar2 = 0;
          puVar2[1] = (char)type + '\x02';
          return 0;
        }
      }
      compiler->error = 2;
      iVar5 = 2;
    }
    else {
      compiler->mode32 = 1;
      iVar5 = 0;
      psVar3 = emit_x86_instruction(compiler,1,0,0,src,srcw);
      if (psVar3 == (sljit_u8 *)0x0) {
        iVar5 = compiler->error;
      }
      else {
        *psVar3 = 0xff;
        psVar3[1] = psVar3[1] | (type < 0x19) * '\x10' + 0x10U;
      }
    }
  }
  return iVar5;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_ijump(struct sljit_compiler *compiler, sljit_s32 type, sljit_s32 src, sljit_sw srcw)
{
	sljit_u8 *inst;
	struct sljit_jump *jump;

	CHECK_ERROR();
	CHECK(check_sljit_emit_ijump(compiler, type, src, srcw));
	ADJUST_LOCAL_OFFSET(src, srcw);

	CHECK_EXTRA_REGS(src, srcw, (void)0);

	if (src == SLJIT_IMM) {
		jump = (struct sljit_jump*)ensure_abuf(compiler, sizeof(struct sljit_jump));
		FAIL_IF_NULL(jump);
		set_jump(jump, compiler, JUMP_ADDR);
		jump->u.target = srcw;

		/* Worst case size. */
#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
		compiler->size += 5;
#else
		compiler->size += 10 + 3;
#endif

		inst = (sljit_u8*)ensure_buf(compiler, 2);
		FAIL_IF_NULL(inst);

		*inst++ = 0;
		*inst++ = type + 2;
	}
	else {
#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
		/* REX_W is not necessary (src is not immediate). */
		compiler->mode32 = 1;
#endif
		inst = emit_x86_instruction(compiler, 1, 0, 0, src, srcw);
		FAIL_IF(!inst);
		*inst++ = GROUP_FF;
		*inst |= (type >= SLJIT_FAST_CALL) ? CALL_rm : JMP_rm;
	}
	return SLJIT_SUCCESS;
}